

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bipartition.cpp
# Opt level: O0

string * __thiscall Bipartition::toString_abi_cxx11_(Bipartition *this)

{
  string *in_RDI;
  string *s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  
  std::__cxx11::string::string((string *)in_RDI);
  boost::to_string<unsigned_long,std::allocator<unsigned_long>,std::__cxx11::string>
            ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI,
             in_stack_ffffffffffffffb8);
  return in_RDI;
}

Assistant:

string Bipartition::toString() {
    string s;
    to_string(partition, s);
    return s;
}